

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

void __thiscall inja::LiteralNode::LiteralNode(LiteralNode *this,string_view data_text,size_t pos)

{
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  string_view data_text_local;
  
  data_text_local._M_str = data_text._M_str;
  data_text_local._M_len = data_text._M_len;
  (this->super_ExpressionNode).super_AstNode.pos = pos;
  (this->super_ExpressionNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_0019cb60;
  local_28 = 0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::parse<std::basic_string_view<char,std::char_traits<char>>&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)&this->value,&data_text_local,(parser_callback_t *)&local_38,true,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

explicit LiteralNode(std::string_view data_text, size_t pos): ExpressionNode(pos), value(json::parse(data_text)) {}